

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fsm.cc
# Opt level: O2

shared_ptr<kratos::AssignStmt> __thiscall
kratos::FSM::get_next_state_stmt
          (FSM *this,Enum *enum_def,EnumVar *next_state,FSMState *state,FSMState *next_fsm_state,
          unordered_map<kratos::FSMState_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<kratos::FSMState_*>,_std::equal_to<kratos::FSMState_*>,_std::allocator<std::pair<kratos::FSMState_*const,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          *state_name_mapping)

{
  FSMState *pFVar1;
  iterator iVar2;
  mapped_type *pmVar3;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  shared_ptr<kratos::AssignStmt> sVar4;
  _Map_base<kratos::FSMState_*,_std::pair<kratos::FSMState_*const,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<kratos::FSMState_*const,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<kratos::FSMState_*>,_std::hash<kratos::FSMState_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
  *in_stack_00000008;
  undefined1 auStack_a8 [8];
  unordered_map<kratos::FSMState_*,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::hash<kratos::FSMState_*>,_std::equal_to<kratos::FSMState_*>,_std::allocator<std::pair<kratos::FSMState_*const,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>_>
  debug_info;
  mapped_type info;
  key_type local_40;
  FSMState *next_fsm_state_local;
  
  info._32_8_ = enum_def;
  local_40 = (key_type)state_name_mapping;
  std::__detail::
  _Map_base<kratos::FSMState_*,_std::pair<kratos::FSMState_*const,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<kratos::FSMState_*const,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<kratos::FSMState_*>,_std::hash<kratos::FSMState_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
  ::at(in_stack_00000008,&local_40);
  Enum::get_enum((Enum *)&debug_info._M_h._M_single_bucket,(string *)next_state);
  auStack_a8 = (undefined1  [8])debug_info._M_h._M_single_bucket;
  debug_info._M_h._M_buckets = (__buckets_ptr)info.first._M_dataplus._M_p;
  debug_info._M_h._M_single_bucket = (__node_base_ptr)0x0;
  info.first._M_dataplus._M_p = (pointer)0x0;
  next_fsm_state_local = (FSMState *)this;
  Var::assign((Var *)this,(shared_ptr<kratos::Var> *)state,(AssignmentType)auStack_a8);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&debug_info);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&info);
  std::
  _Hashtable<kratos::FSMState_*,_std::pair<kratos::FSMState_*const,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>,_std::allocator<std::pair<kratos::FSMState_*const,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>,_std::__detail::_Select1st,_std::equal_to<kratos::FSMState_*>,_std::hash<kratos::FSMState_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::_Hashtable((_Hashtable<kratos::FSMState_*,_std::pair<kratos::FSMState_*const,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>,_std::allocator<std::pair<kratos::FSMState_*const,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>,_std::__detail::_Select1st,_std::equal_to<kratos::FSMState_*>,_std::hash<kratos::FSMState_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                *)auStack_a8,&(next_fsm_state->next_state_fn_ln_)._M_h);
  pFVar1 = next_fsm_state_local;
  if (*(char *)(*(long *)(info._32_8_ + 0x20) + 0xbc) == '\x01') {
    iVar2 = std::
            _Hashtable<kratos::FSMState_*,_std::pair<kratos::FSMState_*const,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>,_std::allocator<std::pair<kratos::FSMState_*const,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>,_std::__detail::_Select1st,_std::equal_to<kratos::FSMState_*>,_std::hash<kratos::FSMState_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
            ::find((_Hashtable<kratos::FSMState_*,_std::pair<kratos::FSMState_*const,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>,_std::allocator<std::pair<kratos::FSMState_*const,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>,_std::__detail::_Select1st,_std::equal_to<kratos::FSMState_*>,_std::hash<kratos::FSMState_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                    *)auStack_a8,&local_40);
    if (iVar2.
        super__Node_iterator_base<std::pair<kratos::FSMState_*const,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>,_false>
        ._M_cur != (__node_type *)0x0) {
      pmVar3 = std::__detail::
               _Map_base<kratos::FSMState_*,_std::pair<kratos::FSMState_*const,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>,_std::allocator<std::pair<kratos::FSMState_*const,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>,_std::__detail::_Select1st,_std::equal_to<kratos::FSMState_*>,_std::hash<kratos::FSMState_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
               ::at((_Map_base<kratos::FSMState_*,_std::pair<kratos::FSMState_*const,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>,_std::allocator<std::pair<kratos::FSMState_*const,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>,_std::__detail::_Select1st,_std::equal_to<kratos::FSMState_*>,_std::hash<kratos::FSMState_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                     *)auStack_a8,&local_40);
      std::
      pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
      ::pair((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
              *)&debug_info._M_h._M_single_bucket,pmVar3);
      std::
      vector<std::pair<std::__cxx11::string,unsigned_int>,std::allocator<std::pair<std::__cxx11::string,unsigned_int>>>
      ::emplace_back<std::pair<std::__cxx11::string,unsigned_int>&>
                ((vector<std::pair<std::__cxx11::string,unsigned_int>,std::allocator<std::pair<std::__cxx11::string,unsigned_int>>>
                  *)((long)&(((pFVar1->super_enable_shared_from_this<kratos::FSMState>)._M_weak_this
                              .super___weak_ptr<kratos::FSMState,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                             )->super_enable_shared_from_this<kratos::FSMState>)._M_weak_this.
                            super___weak_ptr<kratos::FSMState,_(__gnu_cxx::_Lock_policy)2> + 8),
                 (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
                  *)&debug_info._M_h._M_single_bucket);
      std::__cxx11::string::~string((string *)&debug_info._M_h._M_single_bucket);
    }
    debug_info._M_h._M_single_bucket = (__node_base_ptr)anon_var_dwarf_42ada6;
    info.first._M_dataplus._M_p._0_4_ = 0x16d;
    std::
    vector<std::pair<std::__cxx11::string,unsigned_int>,std::allocator<std::pair<std::__cxx11::string,unsigned_int>>>
    ::emplace_back<std::pair<char_const*,int>>
              ((vector<std::pair<std::__cxx11::string,unsigned_int>,std::allocator<std::pair<std::__cxx11::string,unsigned_int>>>
                *)((long)&(((pFVar1->super_enable_shared_from_this<kratos::FSMState>)._M_weak_this.
                            super___weak_ptr<kratos::FSMState,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                          super_enable_shared_from_this<kratos::FSMState>)._M_weak_this.
                          super___weak_ptr<kratos::FSMState,_(__gnu_cxx::_Lock_policy)2> + 8),
               (pair<const_char_*,_int> *)&debug_info._M_h._M_single_bucket);
  }
  std::
  _Hashtable<kratos::FSMState_*,_std::pair<kratos::FSMState_*const,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>,_std::allocator<std::pair<kratos::FSMState_*const,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>,_std::__detail::_Select1st,_std::equal_to<kratos::FSMState_*>,_std::hash<kratos::FSMState_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::~_Hashtable((_Hashtable<kratos::FSMState_*,_std::pair<kratos::FSMState_*const,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>,_std::allocator<std::pair<kratos::FSMState_*const,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>,_std::__detail::_Select1st,_std::equal_to<kratos::FSMState_*>,_std::hash<kratos::FSMState_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                 *)auStack_a8);
  sVar4.super___shared_ptr<kratos::AssignStmt,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  sVar4.super___shared_ptr<kratos::AssignStmt,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)pFVar1;
  return (shared_ptr<kratos::AssignStmt>)
         sVar4.super___shared_ptr<kratos::AssignStmt,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<AssignStmt> FSM::get_next_state_stmt(
    Enum& enum_def, EnumVar& next_state, const FSMState* state, FSMState* next_fsm_state,
    const std::unordered_map<FSMState*, std::string>& state_name_mapping) const {
    auto const& next_fsm_state_name = state_name_mapping.at(next_fsm_state);
    auto stmt = next_state.assign(enum_def.get_enum(next_fsm_state_name), AssignmentType::Blocking);
    auto debug_info = state->next_state_fn_ln();
    if (generator_->debug) {
        if (debug_info.find(next_fsm_state) != debug_info.end()) {
            auto info = debug_info.at(next_fsm_state);
            stmt->fn_name_ln.emplace_back(info);
        }
        stmt->fn_name_ln.emplace_back(std::make_pair(__FILE__, __LINE__));
    }
    return stmt;
}